

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
PairMatcherImpl<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>::
PairMatcherImpl<unsigned_int,proto2_unittest::Proto2MapEnumPlusExtra>
          (PairMatcherImpl<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>
           *this,uint first_matcher,Proto2MapEnumPlusExtra second_matcher)

{
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Proto2MapEnumPlusExtra local_18;
  uint local_14;
  Proto2MapEnumPlusExtra second_matcher_local;
  uint first_matcher_local;
  PairMatcherImpl<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
  *this_local;
  
  local_18 = second_matcher;
  local_14 = first_matcher;
  _second_matcher_local = this;
  MatcherInterface<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>::
  MatcherInterface((MatcherInterface<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                    *)this);
  *(undefined ***)this = &PTR__PairMatcherImpl_029d6d50;
  SafeMatcherCast<unsigned_int_const&,unsigned_int>
            ((Matcher<const_unsigned_int_&> *)(this + 8),(testing *)&local_14,
             (uint *)CONCAT44(extraout_var,extraout_EDX));
  SafeMatcherCast<proto2_unittest::Proto2MapEnumPlusExtra_const&,proto2_unittest::Proto2MapEnumPlusExtra>
            ((Matcher<const_proto2_unittest::Proto2MapEnumPlusExtra_&> *)(this + 0x20),
             (testing *)&local_18,
             (Proto2MapEnumPlusExtra *)CONCAT44(extraout_var_00,extraout_EDX_00));
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}